

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiColumnLocale(Fts5Context *pCtx,int iCol,char **pzLocale,int *pnLocale)

{
  long lVar1;
  int iVar2;
  undefined4 *in_RCX;
  sqlite3_stmt *in_RDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  Fts5Cursor *unaff_retaddr;
  Fts5Config *pConfig;
  Fts5Cursor *pCsr;
  int rc;
  int nDummy;
  char *zDummy;
  uint in_stack_ffffffffffffffc0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd8;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  lVar1 = *(long *)(*in_RDI + 0x18);
  *(undefined8 *)in_RDX = 0;
  *in_RCX = 0;
  if ((in_ESI < 0) || (*(int *)(lVar1 + 0x20) <= in_ESI)) {
    iVar3 = 0x19;
  }
  else if ((((*(char *)(*(long *)(lVar1 + 0x30) + (long)in_ESI) == '\0') &&
            (iVar2 = fts5IsContentless((Fts5FullTable *)*in_RDI,1), iVar2 == 0)) &&
           (*(int *)(lVar1 + 0x70) != 0)) &&
          (iVar3 = fts5SeekCursor(unaff_retaddr,(int)((ulong)lVar4 >> 0x20)), iVar3 == 0)) {
    iVar3 = fts5TextFromStmt((Fts5Config *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),in_RDX,
                             (int)((ulong)in_RCX >> 0x20),(char **)(ulong)in_stack_ffffffffffffffc0,
                             (int *)in_RDI);
    if (iVar3 == 0) {
      *(undefined8 *)in_RDX = *(undefined8 *)(lVar1 + 0xa8);
      *in_RCX = *(undefined4 *)(lVar1 + 0xb0);
    }
    sqlite3Fts5ClearLocale((Fts5Config *)0x284a51);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int fts5ApiColumnLocale(
  Fts5Context *pCtx,
  int iCol,
  const char **pzLocale,
  int *pnLocale
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;

  *pzLocale = 0;
  *pnLocale = 0;

  assert( pCsr->ePlan!=FTS5_PLAN_SPECIAL );
  if( iCol<0 || iCol>=pConfig->nCol ){
    rc = SQLITE_RANGE;
  }else if(
      pConfig->abUnindexed[iCol]==0
   && 0==fts5IsContentless((Fts5FullTable*)pCsr->base.pVtab, 1)
   && pConfig->bLocale
  ){
    rc = fts5SeekCursor(pCsr, 0);
    if( rc==SQLITE_OK ){
      const char *zDummy = 0;
      int nDummy = 0;
      rc = fts5TextFromStmt(pConfig, pCsr->pStmt, iCol, &zDummy, &nDummy);
      if( rc==SQLITE_OK ){
        *pzLocale = pConfig->t.pLocale;
        *pnLocale = pConfig->t.nLocale;
      }
      sqlite3Fts5ClearLocale(pConfig);
    }
  }

  return rc;
}